

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::Region3Backwards::OPline::T_p(OPline *this,double p)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  double x;
  double dVar4;
  ulong local_38;
  size_t i;
  double summer;
  double ln_pi;
  double pi;
  double p_local;
  OPline *this_local;
  
  x = log(p / 1.0);
  i = 0;
  for (local_38 = 0; local_38 < (this->super_Region3RegionDivision).N; local_38 = local_38 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_Region3RegionDivision).n,local_38);
    dVar1 = *pvVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_Region3RegionDivision).I,local_38);
    dVar4 = powi(x,*pvVar3);
    i = (size_t)(dVar1 * dVar4 + (double)i);
  }
  return (double)i * 1.0;
}

Assistant:

virtual double T_p(double p){
                const double pi = p/(1.0*p_fact), ln_pi = log(pi);
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*powi(ln_pi, I[i]);
                }
                return summer*1.0;  // sum is multiplied by T* = 1.0 [K]
            }